

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

CompileInfo * __thiscall xe::ri::List::allocItem<xe::ri::CompileInfo>(List *this)

{
  CompileInfo *this_00;
  CompileInfo *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  this_00 = (CompileInfo *)operator_new(0x88);
  CompileInfo::CompileInfo(this_00);
  local_18 = this_00;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return this_00;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}